

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<capnp::compiler::BrandScope_*> * __thiscall
kj::ArrayBuilder<capnp::compiler::BrandScope_*>::operator=
          (ArrayBuilder<capnp::compiler::BrandScope_*> *this,
          ArrayBuilder<capnp::compiler::BrandScope_*> *other)

{
  RemoveConst<capnp::compiler::BrandScope_*> *ppBVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  ppBVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppBVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (BrandScope **)0x0;
  other->pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
  other->endPtr = (BrandScope **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }